

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

void blitXor(Span *spans,int count,uint8_t *buffer,int offsetX)

{
  byte bVar1;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  short *in_RDI;
  int da;
  uint8_t *ptr;
  int l;
  int x;
  byte *local_30;
  uint local_24;
  int local_c;
  short *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  while (local_c != 0) {
    local_30 = (byte *)(in_RDX + (*local_8 + in_ECX));
    local_24 = (uint)(ushort)local_8[2];
    while (local_24 != 0) {
      bVar1 = divBy255((0xff - (uint)*(byte *)(local_8 + 3)) * (uint)*local_30 +
                       (uint)*(byte *)(local_8 + 3) * (0xff - (uint)*local_30));
      *local_30 = bVar1;
      local_30 = local_30 + 1;
      local_24 = local_24 - 1;
    }
    local_8 = local_8 + 4;
    local_c = local_c + -1;
  }
  return;
}

Assistant:

static void blitXor(VRle::Span *spans, int count, uint8_t *buffer, int offsetX)
{
    while (count--) {
        int    x = spans->x + offsetX;
        int    l = spans->len;
        uint8_t *ptr = buffer + x;
        while (l--) {
            int da = *ptr;
            *ptr = divBy255((255 - spans->coverage) * (da) +
                            spans->coverage * (255 - da));
            ptr++;
        }
        spans++;
    }
}